

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::build_workgroup_size
          (CompilerGLSL *this,
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *arguments,SpecializationConstant *wg_x,SpecializationConstant *wg_y,
          SpecializationConstant *wg_z)

{
  SpecializationConstant *pSVar1;
  uint32_t uVar2;
  SPIRConstant *pSVar3;
  spirv_cross local_158 [32];
  spirv_cross local_138 [32];
  spirv_cross local_118 [32];
  spirv_cross local_f8 [32];
  spirv_cross local_d8 [32];
  spirv_cross local_b8 [32];
  spirv_cross local_98 [32];
  spirv_cross local_78 [32];
  spirv_cross local_58 [32];
  SPIREntryPoint *local_38;
  SPIREntryPoint *execution;
  SpecializationConstant *wg_z_local;
  SpecializationConstant *wg_y_local;
  SpecializationConstant *wg_x_local;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *arguments_local;
  CompilerGLSL *this_local;
  
  execution = (SPIREntryPoint *)wg_z;
  wg_z_local = wg_y;
  wg_y_local = wg_x;
  wg_x_local = (SpecializationConstant *)arguments;
  arguments_local =
       (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        *)this;
  local_38 = Compiler::get_entry_point(&this->super_Compiler);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)wg_y_local);
  pSVar1 = wg_x_local;
  if (uVar2 == 0) {
    join<char_const(&)[16],unsigned_int&>
              (local_98,(char (*) [16])"local_size_x = ",&(local_38->workgroup_size).x);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    ::std::__cxx11::string::~string((string *)local_98);
  }
  else if (((this->options).vulkan_semantics & 1U) == 0) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)wg_y_local);
    pSVar3 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar2);
    join<char_const(&)[16],std::__cxx11::string&>
              (local_78,(char (*) [16])"local_size_x = ",&pSVar3->specialization_constant_macro_name
              );
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    ::std::__cxx11::string::~string((string *)local_78);
  }
  else {
    join<char_const(&)[19],unsigned_int_const&>
              (local_58,(char (*) [19])"local_size_x_id = ",&wg_y_local->constant_id);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    ::std::__cxx11::string::~string((string *)local_58);
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)wg_z_local);
  pSVar1 = wg_x_local;
  if (uVar2 == 0) {
    join<char_const(&)[16],unsigned_int&>
              (local_f8,(char (*) [16])"local_size_y = ",&(local_38->workgroup_size).y);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    ::std::__cxx11::string::~string((string *)local_f8);
  }
  else if (((this->options).vulkan_semantics & 1U) == 0) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)wg_z_local);
    pSVar3 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar2);
    join<char_const(&)[16],std::__cxx11::string&>
              (local_d8,(char (*) [16])"local_size_y = ",&pSVar3->specialization_constant_macro_name
              );
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    ::std::__cxx11::string::~string((string *)local_d8);
  }
  else {
    join<char_const(&)[19],unsigned_int_const&>
              (local_b8,(char (*) [19])"local_size_y_id = ",&wg_z_local->constant_id);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
    ::std::__cxx11::string::~string((string *)local_b8);
  }
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)execution);
  pSVar1 = wg_x_local;
  if (uVar2 == 0) {
    join<char_const(&)[16],unsigned_int&>
              (local_158,(char (*) [16])"local_size_z = ",&(local_38->workgroup_size).z);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158);
    ::std::__cxx11::string::~string((string *)local_158);
  }
  else if (((this->options).vulkan_semantics & 1U) == 0) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)execution);
    pSVar3 = Compiler::get<spirv_cross::SPIRConstant>(&this->super_Compiler,uVar2);
    join<char_const(&)[16],std::__cxx11::string&>
              (local_138,(char (*) [16])"local_size_z = ",
               &pSVar3->specialization_constant_macro_name);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138);
    ::std::__cxx11::string::~string((string *)local_138);
  }
  else {
    join<char_const(&)[19],unsigned_int_const&>
              (local_118,(char (*) [19])"local_size_z_id = ",(uint *)&execution->field_0x4);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)pSVar1,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
    ::std::__cxx11::string::~string((string *)local_118);
  }
  return;
}

Assistant:

void CompilerGLSL::build_workgroup_size(SmallVector<string> &arguments, const SpecializationConstant &wg_x,
                                        const SpecializationConstant &wg_y, const SpecializationConstant &wg_z)
{
	auto &execution = get_entry_point();

	if (wg_x.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_x_id = ", wg_x.constant_id));
		else
			arguments.push_back(join("local_size_x = ", get<SPIRConstant>(wg_x.id).specialization_constant_macro_name));
	}
	else
		arguments.push_back(join("local_size_x = ", execution.workgroup_size.x));

	if (wg_y.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_y_id = ", wg_y.constant_id));
		else
			arguments.push_back(join("local_size_y = ", get<SPIRConstant>(wg_y.id).specialization_constant_macro_name));
	}
	else
		arguments.push_back(join("local_size_y = ", execution.workgroup_size.y));

	if (wg_z.id)
	{
		if (options.vulkan_semantics)
			arguments.push_back(join("local_size_z_id = ", wg_z.constant_id));
		else
			arguments.push_back(join("local_size_z = ", get<SPIRConstant>(wg_z.id).specialization_constant_macro_name));
	}
	else
		arguments.push_back(join("local_size_z = ", execution.workgroup_size.z));
}